

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::LipidHeadVisitor::visit(LipidHeadVisitor *this,RigidBody *rb)

{
  int iVar1;
  element_type *peVar2;
  bool bVar3;
  ostream *poVar4;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::GenericData> data;
  Vector3d newVec;
  Vector3d pos;
  RotMat3x3d rotMatrix;
  allocator<char> local_179;
  __shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> local_178;
  RectMatrix<double,_3U,_3U> local_160;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_108;
  undefined1 local_f8 [16];
  __shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2> local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_d8;
  Vector<double,_3U> local_c8;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_88;
  RectMatrix<double,_3U,_3U> local_70;
  
  Vector<double,_3U>::Vector(&local_a8);
  Vector<double,_3U>::Vector(&local_88);
  local_88.data_[0] = 0.0;
  local_88.data_[1] = 0.0;
  local_88.data_[2] = 1.0;
  Vector<double,_3U>::Vector(&local_c8);
  local_108._M_ptr = (element_type *)0x0;
  local_108._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178._M_ptr = (element_type *)0x0;
  local_178._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._M_ptr = (element_type *)0x0;
  local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_70);
  (*(rb->super_StuntDouble)._vptr_StuntDouble[7])(&local_160,rb);
  bVar3 = canVisit(this,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  if (!bVar3) goto LAB_001e76ce;
  iVar1 = (rb->super_StuntDouble).globalIndex_;
  StuntDouble::getPos((Vector3d *)&local_160,&rb->super_StuntDouble);
  Vector<double,_3U>::operator=(&local_a8,(Vector<double,_3U> *)&local_160);
  StuntDouble::getA((RotMat3x3d *)&local_160,&rb->super_StuntDouble);
  RectMatrix<double,_3U,_3U>::operator=(&local_70,&local_160);
  operator*((Vector<double,_3U> *)&local_160,&local_70,&local_88);
  Vector3<double>::operator=((Vector3<double> *)&local_c8,(Vector<double,_3U> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"ATOMDATA",&local_179);
  StuntDouble::getPropertyByName((StuntDouble *)local_f8,(string *)rb);
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_108,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
  std::__cxx11::string::~string((string *)&local_160);
  if (local_108._M_ptr == (element_type *)0x0) {
    std::make_shared<OpenMD::AtomData>();
LAB_001e75a2:
    std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_178,(__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)&local_160);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_160.data_[0] + 1));
    bVar3 = false;
  }
  else {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>
              ((shared_ptr<OpenMD::GenericData> *)&local_160);
    std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_178,(__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)&local_160);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_160.data_[0] + 1));
    bVar3 = true;
    if (local_178._M_ptr == (element_type *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"can not get Atom Data from ");
      (*(rb->super_StuntDouble)._vptr_StuntDouble[7])(&local_160,rb);
      poVar4 = std::operator<<(poVar4,(string *)&local_160);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_160);
      std::make_shared<OpenMD::AtomData>();
      goto LAB_001e75a2;
    }
  }
  std::make_shared<OpenMD::AtomInfo>();
  std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_118,(__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_160.data_[0] + 1));
  std::__cxx11::string::assign((char *)local_118._M_ptr);
  peVar2 = local_178._M_ptr;
  (local_118._M_ptr)->globalID = iVar1;
  ((local_118._M_ptr)->pos).super_Vector<double,_3U>.data_[0] = local_a8.data_[0];
  ((local_118._M_ptr)->pos).super_Vector<double,_3U>.data_[1] = local_a8.data_[1];
  ((local_118._M_ptr)->pos).super_Vector<double,_3U>.data_[2] = local_a8.data_[2];
  ((local_118._M_ptr)->vec).super_Vector<double,_3U>.data_[0] = local_c8.data_[0];
  ((local_118._M_ptr)->vec).super_Vector<double,_3U>.data_[1] = local_c8.data_[1];
  ((local_118._M_ptr)->vec).super_Vector<double,_3U>.data_[2] = local_c8.data_[2];
  std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d8,&local_118);
  std::
  vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>::
  push_back(&peVar2->data,(value_type *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
  peVar2 = local_178._M_ptr;
  if (!bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"ATOMDATA",(allocator<char> *)local_f8);
    std::__cxx11::string::_M_assign((string *)&(peVar2->super_GenericData).id_);
    std::__cxx11::string::~string((string *)&local_160);
    std::__shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<OpenMD::AtomData,void>(local_e8,&local_178);
    StuntDouble::addProperty(&rb->super_StuntDouble,(shared_ptr<OpenMD::GenericData> *)local_e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
  }
LAB_001e76ce:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  return;
}

Assistant:

void LipidHeadVisitor::visit(RigidBody* rb) {
    int globalID;
    Vector3d pos;
    Vector3d u(0, 0, 1);
    Vector3d newVec;
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    bool haveAtomData;
    RotMat3x3d rotMatrix;

    if (!canVisit(rb->getType())) return;

    globalID  = rb->getGlobalIndex();
    pos       = rb->getPos();
    rotMatrix = rb->getA();
    // matVecMul3(rotMatrix, u, newVec);
    newVec = rotMatrix * u;

    data = rb->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) {
        std::cerr << "can not get Atom Data from " << rb->getType()
                  << std::endl;

        atomData     = std::make_shared<AtomData>();
        haveAtomData = false;

      } else
        haveAtomData = true;

    } else {
      atomData     = std::make_shared<AtomData>();
      haveAtomData = false;
    }

    atomInfo               = std::make_shared<AtomInfo>();
    atomInfo->atomTypeName = "X";
    atomInfo->globalID     = globalID;
    atomInfo->pos[0]       = pos[0];
    atomInfo->pos[1]       = pos[1];
    atomInfo->pos[2]       = pos[2];
    atomInfo->vec[0]       = newVec[0];
    atomInfo->vec[1]       = newVec[1];
    atomInfo->vec[2]       = newVec[2];

    atomData->addAtomInfo(atomInfo);

    if (!haveAtomData) {
      atomData->setID("ATOMDATA");
      rb->addProperty(atomData);
    }
  }